

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ImGuiPayload *pIVar9;
  ImGuiPayload *pIVar10;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  ImGuiPayload *payload_1;
  ImGuiPayload *payload;
  bool accepted_drag_drop;
  int n_1;
  float text_offset_x;
  ImGuiColorEditFlags picker_flags;
  ImGuiColorEditFlags picker_flags_to_forward;
  ImVec4 col_v4;
  float button_offset_x;
  ImGuiWindow *picker_active_window;
  char *p;
  char buf [64];
  int n;
  int fmt_idx;
  bool hide_prefix;
  float w_item_last;
  float w_item_one;
  float inputs_offset_x;
  ImVec2 pos;
  bool value_changed_as_float;
  bool value_changed;
  int i [4];
  float f [4];
  int components;
  bool hdr;
  bool alpha;
  ImGuiColorEditFlags flags_untouched;
  char *label_display_end;
  float w_inputs;
  float w_button;
  float w_full;
  float square_sz;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float *in_stack_000002b0;
  ImGuiColorEditFlags in_stack_000002bc;
  float *in_stack_000002c0;
  char *in_stack_000002c8;
  int in_stack_fffffffffffffde8;
  ImGuiPopupFlags in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  ImVec2 *in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  float in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  float *in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe2c;
  float *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  float local_1a0;
  float local_190;
  float local_18c;
  float flags_00;
  char *in_stack_fffffffffffffe88;
  bool local_165;
  int local_164;
  ImVec2 local_160;
  float local_158;
  uint local_154;
  undefined4 local_150;
  ImGuiColorEditFlags in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  ImVec4 local_124;
  ImVec2 local_114;
  float local_10c;
  ImGuiWindow *local_108;
  float *local_100;
  float local_f8 [3];
  ImGuiTextFlags in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  int local_b4;
  float in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ImVec2 size;
  int local_88 [4];
  float local_78 [7];
  int local_5c;
  bool local_56;
  bool local_55;
  uint local_54;
  char *local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  float local_1c;
  float *local_18;
  char *local_10;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_1c = (float)in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_3c = GetFrameHeight();
    local_40 = CalcItemWidth();
    if (((uint)local_1c & 0x10) == 0) {
      flags_00 = local_3c + (local_38->ItemInnerSpacing).x;
    }
    else {
      flags_00 = 0.0;
    }
    local_48 = local_40 - flags_00;
    local_44 = flags_00;
    local_50 = FindRenderedTextEnd(local_10,(char *)0x0);
    ImGuiNextItemData::ClearFlags(&local_30->NextItemData);
    BeginGroup();
    PushID((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    local_54 = (uint)local_1c;
    if (((uint)local_1c & 0x20) != 0) {
      local_1c = (float)((uint)local_1c & 0xff8fffff | 0x100008);
    }
    if (((uint)local_1c & 8) == 0) {
      ColorEditOptionsPopup
                ((float *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
    }
    if (((uint)local_1c & 0x700000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x700000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x1800000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x1800000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x6000000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x6000000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x18000000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x18000000U | (uint)local_1c);
    }
    uVar7 = (uint)local_1c & 0x700000;
    local_1c = (float)(local_30->ColorEditOptions & 0xe00fffffU | (uint)local_1c);
    bVar4 = ImIsPowerOfTwo(uVar7);
    if (!bVar4) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x1256,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    bVar4 = ImIsPowerOfTwo((uint)local_1c & 0x18000000);
    if (!bVar4) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x1257,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    local_55 = ((uint)local_1c & 2) == 0;
    local_56 = ((uint)local_1c & 0x80000) != 0;
    local_5c = 3;
    if (local_55) {
      local_5c = 4;
    }
    local_78[0] = *local_18;
    local_78[1] = local_18[1];
    local_78[2] = local_18[2];
    if (local_55) {
      local_18c = local_18[3];
    }
    else {
      local_18c = 1.0;
    }
    local_78[3] = local_18c;
    if ((((uint)local_1c & 0x10000000) == 0) || (((uint)local_1c & 0x100000) == 0)) {
      if ((((uint)local_1c & 0x8000000) != 0) && (((uint)local_1c & 0x200000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   &in_stack_fffffffffffffdf8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        iVar6 = memcmp(local_30->ColorEditLastColor,local_18,0xc);
        if (iVar6 == 0) {
          if ((local_78[1] == 0.0) && (!NAN(local_78[1]))) {
            local_78[0] = local_30->ColorEditLastHue;
          }
          if ((local_78[2] == 0.0) && (!NAN(local_78[2]))) {
            local_78[1] = local_30->ColorEditLastSat;
          }
        }
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                 SUB84(in_stack_fffffffffffffe30,0),in_stack_fffffffffffffe2c,
                 in_stack_fffffffffffffe20,
                 (float *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    }
    auVar3 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)local_78[0]),2);
    auVar3 = vblendvps_avx(SUB6416(ZEXT464(0xbf000000),0),SUB6416(ZEXT464(0x3f000000),0),auVar3);
    local_88[0] = (int)(local_78[0] * 255.0 + auVar3._0_4_);
    auVar3 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)local_78[1]),2);
    auVar3 = vblendvps_avx(SUB6416(ZEXT464(0xbf000000),0),SUB6416(ZEXT464(0x3f000000),0),auVar3);
    local_88[1] = (int)(local_78[1] * 255.0 + auVar3._0_4_);
    auVar3 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)local_78[2]),2);
    auVar3 = vblendvps_avx(SUB6416(ZEXT464(0xbf000000),0),SUB6416(ZEXT464(0x3f000000),0),auVar3);
    local_88[2] = (int)(local_78[2] * 255.0 + auVar3._0_4_);
    auVar3 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)local_78[3]),2);
    auVar3 = vblendvps_avx(SUB6416(ZEXT464(0xbf000000),0),SUB6416(ZEXT464(0x3f000000),0),auVar3);
    local_88[3] = (int)(local_78[3] * 255.0 + auVar3._0_4_);
    bVar4 = false;
    bVar11 = false;
    size = (local_28->DC).CursorPos;
    if (local_38->ColorButtonPosition == 0) {
      local_190 = local_44;
    }
    else {
      local_190 = 0.0;
    }
    (local_28->DC).CursorPos.x = size.x + local_190;
    if ((((uint)local_1c & 0x300000) == 0) || (((uint)local_1c & 0x20) != 0)) {
      if ((((uint)local_1c & 0x400000) != 0) && (((uint)local_1c & 0x20) == 0)) {
        if ((local_55 & 1U) == 0) {
          in_stack_fffffffffffffe20 = local_f8;
          uVar7 = ImClamp<int>(local_88[0],0,0xff);
          in_stack_fffffffffffffe2c = (float)ImClamp<int>(local_88[1],0,0xff);
          uVar8 = ImClamp<int>(local_88[2],0,0xff);
          ImFormatString((char *)in_stack_fffffffffffffe20,0x40,"#%02X%02X%02X",(ulong)uVar7,
                         (ulong)(uint)in_stack_fffffffffffffe2c,(ulong)uVar8);
        }
        else {
          in_stack_fffffffffffffe30 = local_f8;
          in_stack_fffffffffffffe3c = ImClamp<int>(local_88[0],0,0xff);
          in_stack_fffffffffffffe40 = ImClamp<int>(local_88[1],0,0xff);
          in_stack_fffffffffffffe44 = ImClamp<int>(local_88[2],0,0xff);
          in_stack_fffffffffffffde8 = ImClamp<int>(local_88[3],0,0xff);
          ImFormatString((char *)in_stack_fffffffffffffe30,0x40,"#%02X%02X%02X%02X",
                         (ulong)in_stack_fffffffffffffe3c,(ulong)in_stack_fffffffffffffe40,
                         (ulong)in_stack_fffffffffffffe44);
        }
        SetNextItemWidth(local_48);
        bVar5 = InputText((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (size_t)in_stack_fffffffffffffe30,
                          (ImGuiInputTextFlags)in_stack_fffffffffffffe2c,
                          (ImGuiInputTextCallback)in_stack_fffffffffffffe20,
                          (void *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        if (bVar5) {
          bVar4 = true;
          local_100 = local_f8;
          while( true ) {
            in_stack_fffffffffffffe1c = CONCAT13(1,(int3)in_stack_fffffffffffffe1c);
            if (*(char *)local_100 != '#') {
              bVar5 = ImCharIsBlankA(*(char *)local_100);
              in_stack_fffffffffffffe1c = CONCAT13(bVar5,(int3)in_stack_fffffffffffffe1c);
            }
            if ((char)((uint)in_stack_fffffffffffffe1c >> 0x18) == '\0') break;
            local_100 = (float *)((long)local_100 + 1);
          }
          local_88[3] = 0;
          local_88[2] = 0;
          local_88[1] = 0;
          local_88[0] = 0;
          if ((local_55 & 1U) == 0) {
            __isoc99_sscanf(local_100,"%02X%02X%02X",local_88,local_88 + 1,local_88 + 2);
          }
          else {
            __isoc99_sscanf(local_100,"%02X%02X%02X%02X",local_88,local_88 + 1,local_88 + 2,
                            local_88 + 3);
          }
        }
        if (((uint)local_1c & 8) == 0) {
          OpenPopupOnItemClick
                    ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        }
      }
    }
    else {
      auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)((local_48 -
                                                 (local_38->ItemInnerSpacing).x *
                                                 (float)(local_5c + -1)) / (float)local_5c)));
      fVar12 = ImMax<float>(1.0,auVar3._0_4_);
      auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(local_48 -
                                                (fVar12 + (local_38->ItemInnerSpacing).x) *
                                                (float)(local_5c + -1))));
      in_stack_ffffffffffffff60 = ImMax<float>(1.0,auVar3._0_4_);
      in_stack_ffffffffffffff64 = fVar12;
      auVar13._0_8_ =
           CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        (char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        SUB41((uint)in_stack_fffffffffffffe0c >> 0x18,0),in_stack_fffffffffffffe08);
      auVar13._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar13._0_16_);
      in_stack_ffffffffffffff54 = (float)uVar1;
      in_stack_ffffffffffffff58 = (undefined4)((ulong)uVar1 >> 0x20);
      in_stack_ffffffffffffff5c =
           CONCAT13(fVar12 <= in_stack_ffffffffffffff54,(int3)in_stack_ffffffffffffff5c);
      for (local_b4 = 0; local_b4 < local_5c; local_b4 = local_b4 + 1) {
        if (0 < local_b4) {
          SameLine(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0);
        }
        local_1a0 = in_stack_ffffffffffffff60;
        if (local_b4 + 1 < local_5c) {
          local_1a0 = in_stack_ffffffffffffff64;
        }
        SetNextItemWidth(local_1a0);
        fVar12 = (float)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (((uint)local_1c & 0x1000000) == 0) {
          bVar5 = DragInt((char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                          in_stack_fffffffffffffe04,(int)in_stack_fffffffffffffe00,(int)fVar12,
                          (char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                          in_stack_fffffffffffffdec);
          bVar4 = bVar4 != false || bVar5;
        }
        else {
          bVar5 = DragFloat((char *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,fVar12,
                            (char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            in_stack_fffffffffffffdec);
          bVar4 = bVar4 != false || bVar5;
          bVar11 = bVar11 || bVar4;
        }
        if (((uint)local_1c & 8) == 0) {
          OpenPopupOnItemClick
                    ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        }
      }
    }
    local_108 = (ImGuiWindow *)0x0;
    if (((uint)local_1c & 0x10) == 0) {
      if ((((uint)local_1c & 0x20) == 0) && (local_38->ColorButtonPosition != 0)) {
        in_stack_fffffffffffffe18 = local_48 + (local_38->ItemInnerSpacing).x;
      }
      else {
        in_stack_fffffffffffffe18 = 0.0;
      }
      local_10c = in_stack_fffffffffffffe18;
      ImVec2::ImVec2(&local_114,size.x + in_stack_fffffffffffffe18,size.y);
      (local_28->DC).CursorPos = local_114;
      in_stack_fffffffffffffe0c = *local_18;
      in_stack_fffffffffffffe10 = local_18[1];
      in_stack_fffffffffffffe14 = local_18[2];
      if ((local_55 & 1U) == 0) {
        fVar12 = 1.0;
      }
      else {
        fVar12 = local_18[3];
      }
      ImVec4::ImVec4(&local_124,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe10,
                     in_stack_fffffffffffffe14,fVar12);
      in_stack_fffffffffffffe04 = local_1c;
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffed4,0.0,0.0);
      bVar5 = ColorButton((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (ImVec4 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (ImGuiColorEditFlags)in_stack_ffffffffffffff54,size);
      if ((bVar5) && (((uint)local_1c & 4) == 0)) {
        (local_30->ColorPickerRef).x = local_124.x;
        (local_30->ColorPickerRef).y = local_124.y;
        (local_30->ColorPickerRef).z = local_124.z;
        (local_30->ColorPickerRef).w = local_124.w;
        OpenPopup((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                  in_stack_fffffffffffffdec);
        auVar14._0_8_ =
             ImRect::GetBL((ImRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        auVar14._8_56_ = extraout_var_00;
        vmovlpd_avx(auVar14._0_16_);
        in_stack_fffffffffffffdf8 = (ImVec2 *)&stack0xfffffffffffffebc;
        ImVec2::ImVec2(in_stack_fffffffffffffdf8,-1.0,(local_38->ItemSpacing).y);
        auVar15._0_8_ =
             ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (ImVec2 *)0x1f7143);
        auVar15._8_56_ = extraout_var_01;
        vmovlpd_avx(auVar15._0_16_);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb4,0.0,0.0);
        SetNextWindowPos((ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (ImGuiCond)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                         (ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
      if (((uint)local_1c & 8) == 0) {
        OpenPopupOnItemClick
                  ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      }
      bVar5 = BeginPopup((char *)in_stack_fffffffffffffdf8,
                         (ImGuiWindowFlags)in_stack_fffffffffffffdf4);
      if (bVar5) {
        local_108 = local_30->CurrentWindow;
        if (local_10 != local_50) {
          TextEx(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
          Spacing();
        }
        local_150 = 0x1f890002;
        local_154 = local_54 & 0x1f890002 | 0x740080;
        SetNextItemWidth(local_3c * 12.0);
        bVar5 = ColorPicker4(in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,in_stack_000002b0
                            );
        bVar4 = bVar4 != false || bVar5;
        EndPopup();
      }
    }
    if ((local_10 != local_50) && (((uint)local_1c & 0x80) == 0)) {
      in_stack_fffffffffffffdf4 = local_44;
      if (((uint)local_1c & 0x20) == 0) {
        in_stack_fffffffffffffdf4 = local_40 + (local_38->ItemInnerSpacing).x;
      }
      local_158 = in_stack_fffffffffffffdf4;
      ImVec2::ImVec2(&local_160,size.x + in_stack_fffffffffffffdf4,
                     size.y + (local_38->FramePadding).y);
      (local_28->DC).CursorPos = local_160;
      TextEx(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    }
    if ((bVar4 != false) && (local_108 == (ImGuiWindow *)0x0)) {
      if (!bVar11) {
        for (local_164 = 0; local_164 < 4; local_164 = local_164 + 1) {
          local_78[local_164] = (float)local_88[local_164] / 255.0;
        }
      }
      if ((((uint)local_1c & 0x200000) != 0) && (((uint)local_1c & 0x8000000) != 0)) {
        local_30->ColorEditLastHue = local_78[0];
        local_30->ColorEditLastSat = local_78[1];
        ColorConvertHSVtoRGB
                  ((float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                   SUB84(in_stack_fffffffffffffe30,0),in_stack_fffffffffffffe2c,
                   in_stack_fffffffffffffe20,
                   (float *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        *(ulong *)local_30->ColorEditLastColor = CONCAT44(local_78[1],local_78[0]);
        local_30->ColorEditLastColor[2] = local_78[2];
      }
      if ((((uint)local_1c & 0x100000) != 0) && (((uint)local_1c & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   &in_stack_fffffffffffffdf8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
      *local_18 = local_78[0];
      local_18[1] = local_78[1];
      local_18[2] = local_78[2];
      if ((local_55 & 1U) != 0) {
        local_18[3] = local_78[3];
      }
    }
    PopID();
    EndGroup();
    if (((((local_28->DC).LastItemStatusFlags & 1U) != 0) && (((uint)local_1c & 0x200) == 0)) &&
       (bVar11 = BeginDragDropTarget(), bVar11)) {
      pIVar9 = AcceptDragDropPayload(in_stack_fffffffffffffe88,(ImGuiDragDropFlags)flags_00);
      if (pIVar9 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar9->Data;
        *(undefined8 *)local_18 = *puVar2;
        local_18[2] = *(float *)(puVar2 + 1);
        bVar4 = true;
      }
      pIVar10 = AcceptDragDropPayload(in_stack_fffffffffffffe88,(ImGuiDragDropFlags)flags_00);
      if (pIVar10 != (ImGuiPayload *)0x0) {
        memcpy(local_18,pIVar10->Data,(long)local_5c << 2);
        bVar4 = true;
      }
      local_165 = pIVar10 != (ImGuiPayload *)0x0 || pIVar9 != (ImGuiPayload *)0x0;
      if ((local_165) && (((uint)local_1c & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   &in_stack_fffffffffffffdf8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
      EndDragDropTarget();
    }
    if (((local_108 != (ImGuiWindow *)0x0) && (local_30->ActiveId != 0)) &&
       (local_30->ActiveIdWindow == local_108)) {
      (local_28->DC).LastItemId = local_30->ActiveId;
    }
    local_1 = bVar4;
    if (bVar4 != false) {
      MarkItemEdited((ImGuiID)in_stack_fffffffffffffdf4);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ColorEdit4(const char* label, float col[4], ImGuiColorEditFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float square_sz = GetFrameHeight();
    const float w_full = CalcItemWidth();
    const float w_button = (flags & ImGuiColorEditFlags_NoSmallPreview) ? 0.0f : (square_sz + style.ItemInnerSpacing.x);
    const float w_inputs = w_full - w_button;
    const char* label_display_end = FindRenderedTextEnd(label);
    g.NextItemData.ClearFlags();

    BeginGroup();
    PushID(label);

    // If we're not showing any slider there's no point in doing any HSV conversions
    const ImGuiColorEditFlags flags_untouched = flags;
    if (flags & ImGuiColorEditFlags_NoInputs)
        flags = (flags & (~ImGuiColorEditFlags__DisplayMask)) | ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_NoOptions;

    // Context menu: display and modify options (before defaults are applied)
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorEditOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__DisplayMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__DisplayMask);
    if (!(flags & ImGuiColorEditFlags__DataTypeMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__DataTypeMask);
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__PickerMask);
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__InputMask);
    flags |= (g.ColorEditOptions & ~(ImGuiColorEditFlags__DisplayMask | ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask | ImGuiColorEditFlags__InputMask));
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));   // Check that only 1 is selected

    const bool alpha = (flags & ImGuiColorEditFlags_NoAlpha) == 0;
    const bool hdr = (flags & ImGuiColorEditFlags_HDR) != 0;
    const int components = alpha ? 4 : 3;

    // Convert to the formats we need
    float f[4] = { col[0], col[1], col[2], alpha ? col[3] : 1.0f };
    if ((flags & ImGuiColorEditFlags_InputHSV) && (flags & ImGuiColorEditFlags_DisplayRGB))
        ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
    else if ((flags & ImGuiColorEditFlags_InputRGB) && (flags & ImGuiColorEditFlags_DisplayHSV))
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (f[1] == 0)
                f[0] = g.ColorEditLastHue;
            if (f[2] == 0)
                f[1] = g.ColorEditLastSat;
        }
    }
    int i[4] = { IM_F32_TO_INT8_UNBOUND(f[0]), IM_F32_TO_INT8_UNBOUND(f[1]), IM_F32_TO_INT8_UNBOUND(f[2]), IM_F32_TO_INT8_UNBOUND(f[3]) };

    bool value_changed = false;
    bool value_changed_as_float = false;

    const ImVec2 pos = window->DC.CursorPos;
    const float inputs_offset_x = (style.ColorButtonPosition == ImGuiDir_Left) ? w_button : 0.0f;
    window->DC.CursorPos.x = pos.x + inputs_offset_x;

    if ((flags & (ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_DisplayHSV)) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB/HSV 0..255 Sliders
        const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_inputs - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
        const float w_item_last = ImMax(1.0f, IM_FLOOR(w_inputs - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));

        const bool hide_prefix = (w_item_one <= CalcTextSize((flags & ImGuiColorEditFlags_Float) ? "M:0.000" : "M:000").x);
        static const char* ids[4] = { "##X", "##Y", "##Z", "##W" };
        static const char* fmt_table_int[3][4] =
        {
            {   "%3d",   "%3d",   "%3d",   "%3d" }, // Short display
            { "R:%3d", "G:%3d", "B:%3d", "A:%3d" }, // Long display for RGBA
            { "H:%3d", "S:%3d", "V:%3d", "A:%3d" }  // Long display for HSVA
        };
        static const char* fmt_table_float[3][4] =
        {
            {   "%0.3f",   "%0.3f",   "%0.3f",   "%0.3f" }, // Short display
            { "R:%0.3f", "G:%0.3f", "B:%0.3f", "A:%0.3f" }, // Long display for RGBA
            { "H:%0.3f", "S:%0.3f", "V:%0.3f", "A:%0.3f" }  // Long display for HSVA
        };
        const int fmt_idx = hide_prefix ? 0 : (flags & ImGuiColorEditFlags_DisplayHSV) ? 2 : 1;

        for (int n = 0; n < components; n++)
        {
            if (n > 0)
                SameLine(0, style.ItemInnerSpacing.x);
            SetNextItemWidth((n + 1 < components) ? w_item_one : w_item_last);

            // FIXME: When ImGuiColorEditFlags_HDR flag is passed HS values snap in weird ways when SV values go below 0.
            if (flags & ImGuiColorEditFlags_Float)
            {
                value_changed |= DragFloat(ids[n], &f[n], 1.0f / 255.0f, 0.0f, hdr ? 0.0f : 1.0f, fmt_table_float[fmt_idx][n]);
                value_changed_as_float |= value_changed;
            }
            else
            {
                value_changed |= DragInt(ids[n], &i[n], 1.0f, 0, hdr ? 0 : 255, fmt_table_int[fmt_idx][n]);
            }
            if (!(flags & ImGuiColorEditFlags_NoOptions))
                OpenPopupOnItemClick("context");
        }
    }
    else if ((flags & ImGuiColorEditFlags_DisplayHex) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB Hexadecimal Input
        char buf[64];
        if (alpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", ImClamp(i[0], 0, 255), ImClamp(i[1], 0, 255), ImClamp(i[2], 0, 255), ImClamp(i[3], 0, 255));
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", ImClamp(i[0], 0, 255), ImClamp(i[1], 0, 255), ImClamp(i[2], 0, 255));
        SetNextItemWidth(w_inputs);
        if (InputText("##Text", buf, IM_ARRAYSIZE(buf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase))
        {
            value_changed = true;
            char* p = buf;
            while (*p == '#' || ImCharIsBlankA(*p))
                p++;
            i[0] = i[1] = i[2] = i[3] = 0;
            if (alpha)
                sscanf(p, "%02X%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2], (unsigned int*)&i[3]); // Treat at unsigned (%X is unsigned)
            else
                sscanf(p, "%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2]);
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }

    ImGuiWindow* picker_active_window = NULL;
    if (!(flags & ImGuiColorEditFlags_NoSmallPreview))
    {
        const float button_offset_x = ((flags & ImGuiColorEditFlags_NoInputs) || (style.ColorButtonPosition == ImGuiDir_Left)) ? 0.0f : w_inputs + style.ItemInnerSpacing.x;
        window->DC.CursorPos = ImVec2(pos.x + button_offset_x, pos.y);

        const ImVec4 col_v4(col[0], col[1], col[2], alpha ? col[3] : 1.0f);
        if (ColorButton("##ColorButton", col_v4, flags))
        {
            if (!(flags & ImGuiColorEditFlags_NoPicker))
            {
                // Store current color and open a picker
                g.ColorPickerRef = col_v4;
                OpenPopup("picker");
                SetNextWindowPos(window->DC.LastItemRect.GetBL() + ImVec2(-1, style.ItemSpacing.y));
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        if (BeginPopup("picker"))
        {
            picker_active_window = g.CurrentWindow;
            if (label != label_display_end)
            {
                TextEx(label, label_display_end);
                Spacing();
            }
            ImGuiColorEditFlags picker_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaBar;
            ImGuiColorEditFlags picker_flags = (flags_untouched & picker_flags_to_forward) | ImGuiColorEditFlags__DisplayMask | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_AlphaPreviewHalf;
            SetNextItemWidth(square_sz * 12.0f); // Use 256 + bar sizes?
            value_changed |= ColorPicker4("##picker", col, picker_flags, &g.ColorPickerRef.x);
            EndPopup();
        }
    }

    if (label != label_display_end && !(flags & ImGuiColorEditFlags_NoLabel))
    {
        const float text_offset_x = (flags & ImGuiColorEditFlags_NoInputs) ? w_button : w_full + style.ItemInnerSpacing.x;
        window->DC.CursorPos = ImVec2(pos.x + text_offset_x, pos.y + style.FramePadding.y);
        TextEx(label, label_display_end);
    }

    // Convert back
    if (value_changed && picker_active_window == NULL)
    {
        if (!value_changed_as_float)
            for (int n = 0; n < 4; n++)
                f[n] = i[n] / 255.0f;
        if ((flags & ImGuiColorEditFlags_DisplayHSV) && (flags & ImGuiColorEditFlags_InputRGB))
        {
            g.ColorEditLastHue = f[0];
            g.ColorEditLastSat = f[1];
            ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
            memcpy(g.ColorEditLastColor, f, sizeof(float) * 3);
        }
        if ((flags & ImGuiColorEditFlags_DisplayRGB) && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);

        col[0] = f[0];
        col[1] = f[1];
        col[2] = f[2];
        if (alpha)
            col[3] = f[3];
    }

    PopID();
    EndGroup();

    // Drag and Drop Target
    // NB: The flag test is merely an optional micro-optimization, BeginDragDropTarget() does the same test.
    if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropTarget())
    {
        bool accepted_drag_drop = false;
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * 3); // Preserve alpha if any //-V512
            value_changed = accepted_drag_drop = true;
        }
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * components);
            value_changed = accepted_drag_drop = true;
        }

        // Drag-drop payloads are always RGB
        if (accepted_drag_drop && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(col[0], col[1], col[2], col[0], col[1], col[2]);
        EndDragDropTarget();
    }

    // When picker is being actively used, use its active id so IsItemActive() will function on ColorEdit4().
    if (picker_active_window && g.ActiveId != 0 && g.ActiveIdWindow == picker_active_window)
        window->DC.LastItemId = g.ActiveId;

    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    return value_changed;
}